

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  size_t __len;
  char *pcVar6;
  ptrdiff_t _Num;
  
  sVar2 = *(size_t *)(this + 0x10);
  if (sVar2 != 0) {
    pcVar6 = *it;
    memmove(pcVar6,*(void **)(this + 8),sVar2);
    *it = pcVar6 + sVar2;
  }
  __s = *it;
  sVar2 = *(size_t *)(this + 0x20);
  pcVar6 = __s;
  if (sVar2 != 0) {
    pcVar6 = __s + sVar2;
    memset(__s,*(int *)(this + 0x18),sVar2);
  }
  *it = pcVar6;
  iVar1 = *(int *)(this + 0x2c);
  pbVar4 = (byte *)(__s + sVar2 + (long)iVar1);
  uVar5 = *(uint *)(this + 0x28);
  do {
    pbVar4 = pbVar4 + -1;
    *pbVar4 = (byte)uVar5 & 7 | 0x30;
    bVar3 = 7 < uVar5;
    uVar5 = uVar5 >> 3;
  } while (bVar3);
  *it = pcVar6 + iVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }